

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  undefined1 local_80 [8];
  string_buf buf;
  size_t type_len;
  size_t n_len;
  size_t e_len;
  uchar *type;
  uchar *n;
  uchar *e;
  RSA *rsactx;
  void **abstract_local;
  size_t hostkey_data_len_local;
  uchar *hostkey_data_local;
  LIBSSH2_SESSION *session_local;
  
  rsactx = (RSA *)abstract;
  abstract_local = (void **)hostkey_data_len;
  hostkey_data_len_local = (size_t)hostkey_data;
  hostkey_data_local = (uchar *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_rsa_dtor(session,abstract);
    *(undefined8 *)rsactx = 0;
  }
  if (abstract_local < (void **)0x13) {
    session_local._4_4_ = -1;
  }
  else {
    local_80 = (undefined1  [8])hostkey_data_len_local;
    buf.data = (uchar *)hostkey_data_len_local;
    buf.dataptr = (uchar *)abstract_local;
    iVar1 = _libssh2_get_string((string_buf *)local_80,(uchar **)&e_len,&buf.len);
    if (iVar1 == 0) {
      if ((((buf.len == 7) && (iVar1 = strncmp("ssh-rsa",(char *)e_len,7), iVar1 == 0)) ||
          ((buf.len == 0xc && (iVar1 = strncmp("rsa-sha2-256",(char *)e_len,0xc), iVar1 == 0)))) ||
         ((buf.len == 0xc && (iVar1 = strncmp("rsa-sha2-512",(char *)e_len,0xc), iVar1 == 0)))) {
        iVar1 = _libssh2_get_string((string_buf *)local_80,&n,&n_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_string((string_buf *)local_80,&type,&type_len);
          if (iVar1 == 0) {
            iVar1 = _libssh2_eob((string_buf *)local_80);
            if (iVar1 == 0) {
              session_local._4_4_ = -1;
            }
            else {
              iVar1 = _libssh2_rsa_new((RSA **)&e,n,n_len,type,type_len,(uchar *)0x0,0,(uchar *)0x0,
                                       0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0
                                      );
              if (iVar1 == 0) {
                *(uchar **)rsactx = e;
                session_local._4_4_ = 0;
              }
              else {
                session_local._4_4_ = -1;
              }
            }
          }
          else {
            session_local._4_4_ = -1;
          }
        }
        else {
          session_local._4_4_ = -1;
        }
      }
      else {
        session_local._4_4_ = -1;
      }
    }
    else {
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_rsa_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    unsigned char *e, *n, *type;
    size_t e_len, n_len, type_len;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 19) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_get_string(&buf, &type, &type_len)) {
        return -1;
    }

    /* we accept one of 3 header types */
#if LIBSSH2_RSA_SHA1
    if(type_len == 7 && strncmp("ssh-rsa", (char *)type, 7) == 0) {
        /* ssh-rsa */
    }
    else
#endif
#if LIBSSH2_RSA_SHA2
    if(type_len == 12 && strncmp("rsa-sha2-256", (char *)type, 12) == 0) {
        /* rsa-sha2-256 */
    }
    else if(type_len == 12 && strncmp("rsa-sha2-512", (char *)type, 12) == 0) {
        /* rsa-sha2-512 */
    }
    else
#endif
    {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "unexpected rsa type: %.*s", type_len, type));
        return -1;
    }

    if(_libssh2_get_string(&buf, &e, &e_len))
        return -1;

    if(_libssh2_get_string(&buf, &n, &n_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_rsa_new(&rsactx,
                        e, (unsigned long)e_len,
                        n, (unsigned long)n_len,
                        NULL, 0, NULL, 0, NULL, 0,
                        NULL, 0, NULL, 0, NULL, 0)) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}